

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::SetEnum
          (ExtensionSet *this,int number,FieldType type,int value,FieldDescriptor *descriptor)

{
  int key;
  string *extraout_RAX;
  Extension *pEVar1;
  string *psVar2;
  int index;
  ExtensionSet *pEVar3;
  LogMessageFatal *pLVar4;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar5;
  LogMessageFatal aLStack_58 [16];
  ulong uStack_48;
  Extension *pEStack_40;
  
  pEStack_40 = (Extension *)0x13a3da;
  pVar5 = Insert(this,number);
  pEVar1 = pVar5.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar1->is_repeated != false) goto LAB_0013a479;
    psVar2 = (string *)0x0;
LAB_0013a42a:
    if (psVar2 != (string *)0x0) {
      pEStack_40 = (Extension *)0x13a4ce;
      SetEnum();
      goto LAB_0013a4ce;
    }
    if ((byte)(pEVar1->type - 0x13) < 0xee) {
      pEVar3 = (ExtensionSet *)&stack0xffffffffffffffd0;
      pEStack_40 = (Extension *)0x13a498;
      SetEnum(pEVar3);
      goto LAB_0013a498;
    }
    if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 8) {
      psVar2 = (string *)0x0;
    }
    else {
      pEStack_40 = (Extension *)0x13a4bf;
      psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                          (ulong)pEVar1->type * 4),8,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
    }
    if (psVar2 == (string *)0x0) goto LAB_0013a45b;
  }
  else {
    pEVar1->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      pEStack_40 = (Extension *)0x13a479;
      SetEnum((ExtensionSet *)&stack0xffffffffffffffd0);
LAB_0013a479:
      pEStack_40 = (Extension *)0x13a48c;
      psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (0,1,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
      goto LAB_0013a42a;
    }
    pEVar3 = (ExtensionSet *)
             (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4);
    if (pEVar3 == (ExtensionSet *)0x8) {
      psVar2 = (string *)0x0;
    }
    else {
LAB_0013a498:
      pEStack_40 = (Extension *)0x13a4a9;
      psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pEVar3,8,"cpp_type(extension->type) == WireFormatLite::CPPTYPE_ENUM"
                         );
    }
    if (psVar2 == (string *)0x0) {
      pEVar1->is_repeated = false;
      pEVar1->field_0xa = pEVar1->field_0xa & 0xfe;
LAB_0013a45b:
      pEVar1->field_0xa = pEVar1->field_0xa & 0xfd;
      (pEVar1->field_0).enum_value = value;
      return;
    }
LAB_0013a4ce:
    pEStack_40 = (Extension *)0x13a4db;
    SetEnum();
    psVar2 = extraout_RAX;
  }
  key = (int)psVar2;
  pEVar3 = (ExtensionSet *)&stack0xffffffffffffffd0;
  pEStack_40 = (Extension *)GetRepeatedEnum;
  SetEnum();
  uStack_48 = (ulong)(uint)value;
  pEStack_40 = pEVar1;
  pEVar1 = FindOrNull(pEVar3,key);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_58,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x1f8,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_58,0x25,"Index out-of-bounds (field is empty).");
    goto LAB_0013a5e0;
  }
  if (pEVar1->is_repeated == false) {
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (1,0,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                       );
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    if ((byte)(pEVar1->type - 0x13) < 0xee) {
      pLVar4 = aLStack_58;
      GetRepeatedEnum();
LAB_0013a5b0:
      psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pLVar4,8,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
    }
    else {
      pLVar4 = (LogMessageFatal *)
               (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4);
      if (pLVar4 != (LogMessageFatal *)0x8) goto LAB_0013a5b0;
      psVar2 = (string *)0x0;
    }
    if (psVar2 == (string *)0x0) {
      RepeatedField<int>::Get((RepeatedField<int> *)pEVar1->field_0,index);
      return;
    }
  }
  else {
    GetRepeatedEnum();
  }
  GetRepeatedEnum();
LAB_0013a5e0:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_58);
}

Assistant:

void ExtensionSet::SetEnum(int number, FieldType type, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = false;
    extension->is_pointer = false;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
  }
  extension->is_cleared = false;
  extension->enum_value = value;
}